

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgt_push_image_hdr(djg_texture *texture,char *filename,bool flipy)

{
  FILE *__stream;
  djg_texture *texture_00;
  float *pfVar1;
  char *pcVar2;
  bool bVar3;
  djg_texture *tail;
  bool flipy_local;
  char *filename_local;
  djg_texture *texture_local;
  
  texture_00 = djgt_create(texture->comp);
  texture_00->pf = 4;
  pfVar1 = stbi_loadf(filename,&texture_00->x,&texture_00->y,&texture_00->comp,texture->comp);
  texture_00->texels = (char *)pfVar1;
  bVar3 = texture_00->texels != (char *)0x0;
  if (bVar3) {
    djgt__push_texture(texture,texture_00,flipy);
  }
  else {
    fprintf(_stdout,"djg_error: Image loading failed\n");
    fflush(_stdout);
    fprintf(_stdout,"-- Begin -- STBI Log\n");
    fflush(_stdout);
    __stream = _stdout;
    pcVar2 = stbi_failure_reason();
    fprintf(__stream,"%s\n",pcVar2);
    fflush(_stdout);
    fprintf(_stdout,"-- End -- STBI Log\n");
    fflush(_stdout);
    djgt_release(texture_00);
  }
  return bVar3;
}

Assistant:

DJGDEF bool
djgt_push_image_hdr(djg_texture *texture, const char *filename, bool flipy)
{
    djg_texture *tail = djgt_create(texture->comp);

    tail->pf = DJGT_PF_F32;
    tail->texels = (char *)stbi_loadf(
        filename, &tail->x, &tail->y, &tail->comp, texture->comp
    );
    if (!tail->texels) {
        DJG_LOG("djg_error: Image loading failed\n");
#ifndef STBI_NO_FAILURE_STRINGS
        DJG_LOG("-- Begin -- STBI Log\n");
        DJG_LOG("%s\n", stbi_failure_reason());
        DJG_LOG("-- End -- STBI Log\n");
#endif // STBI_NO_FAILURE_STRINGS
        djgt_release(tail);

        return false;
    }
    djgt__push_texture(texture, tail, flipy);

    return true;
}